

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcs_char_traits.hpp
# Opt level: O2

size_t boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(const_char *cstr)

{
  long lVar1;
  size_t sVar2;
  const_char *ptr;
  
  sVar2 = 0xffffffffffffffff;
  do {
    lVar1 = sVar2 + 1;
    sVar2 = sVar2 + 1;
  } while (cstr[lVar1] != '\0');
  return sVar2;
}

Assistant:

static std::size_t length( const_char* cstr )
    {
        const_char null_char = CharT();

        const_char* ptr = cstr;
        while( !eq( *ptr, null_char ) )
            ++ptr;

        return ptr - cstr;
    }